

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  longlong lVar7;
  ImGuiDataType data_type_00;
  uint uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  double local_88;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar4 = GImGui;
  uVar8 = data_type & 0xfffffffe;
  bVar11 = uVar8 != 8;
  bVar1 = v_max <= v_min;
  bVar2 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar9 = flags & 1;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar5 = IsMousePosValid((ImVec2 *)0x0), !bVar5)) ||
     ((pIVar4->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    fVar15 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar6 = 0;
      if (uVar8 == 8) {
        uVar6 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar15 = *(float *)(local_48 + (ulong)uVar9 * 4 + -8);
      if ((int)uVar6 < 0) {
        fVar14 = 1.1754944e-38;
      }
      else if ((int)uVar6 < 10) {
        fVar14 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar6 * 4);
      }
      else {
        local_48 = ZEXT416((uint)fVar15);
        fVar14 = powf(10.0,(float)(int)-uVar6);
        fVar15 = (float)local_48._0_4_;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar14 <= v_speed) |
                       ~-(uint)(fVar14 <= v_speed) & (uint)fVar14);
    }
  }
  else {
    fVar15 = (pIVar4->IO).NavInputs[(ulong)uVar9 + 0x1e];
    if ((pIVar4->IO).KeyAlt != false) {
      fVar15 = fVar15 * 0.01;
    }
    if ((pIVar4->IO).KeyShift == true) {
      fVar15 = fVar15 * 10.0;
    }
  }
  fVar15 = fVar15 * v_speed;
  fVar14 = fVar15;
  if (uVar9 != 0) {
    fVar14 = -fVar15;
  }
  lVar10 = v_max - v_min;
  if (lVar10 == 0 || v_max < v_min) {
    bVar5 = false;
  }
  else if ((*v < v_max) || (bVar5 = true, fVar14 <= 0.0)) {
    bVar5 = fVar14 < 0.0 && *v <= v_min;
  }
  if ((bVar1 || bVar11) || bVar2) {
LAB_0035958c:
    bVar3 = false;
  }
  else if ((0.0 <= fVar14) || (bVar3 = true, pIVar4->DragCurrentAccum <= 0.0)) {
    if (fVar14 <= 0.0) goto LAB_0035958c;
    bVar3 = pIVar4->DragCurrentAccum <= 0.0 && pIVar4->DragCurrentAccum != 0.0;
  }
  if (((pIVar4->ActiveIdIsJustActivated & 1U) != 0 || bVar5) || (bVar3)) {
    pIVar4->DragCurrentAccum = 0.0;
    bVar5 = false;
  }
  else {
    if ((fVar15 == 0.0) && (!NAN(fVar15))) goto LAB_003595cf;
    pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum + fVar14;
    bVar5 = true;
  }
  pIVar4->DragCurrentAccumDirty = bVar5;
LAB_003595cf:
  if (pIVar4->DragCurrentAccumDirty != true) {
    return false;
  }
  lVar7 = v_max;
  if ((bVar1 || bVar11) || bVar2) {
    data_type_00 = (int)*v + (int)(long)pIVar4->DragCurrentAccum;
    local_88 = 0.0;
  }
  else {
    local_88 = pow((double)(*v - v_min) / (double)lVar10,1.0 / (double)power);
    fVar12 = (float)((double)(pIVar4->DragCurrentAccum / (float)lVar10) + local_88);
    fVar15 = 1.0;
    if (fVar12 <= 1.0) {
      fVar15 = fVar12;
    }
    fVar15 = powf((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar15),power);
    data_type_00 = (int)(long)fVar15 * (int)lVar10 + (int)v_min;
  }
  lVar7 = RoundScalarWithFormatT<long_long,long_long>
                    ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,lVar7);
  pIVar4->DragCurrentAccumDirty = false;
  if ((bVar1 || bVar11) || bVar2) {
    fVar15 = (float)(lVar7 - *v);
  }
  else {
    dVar13 = pow((double)(lVar7 - v_min) / (double)lVar10,1.0 / (double)power);
    fVar15 = (float)(dVar13 - local_88);
  }
  pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - fVar15;
  lVar10 = *v;
  if ((v_min < v_max) && (lVar10 != lVar7)) {
    if ((lVar7 < v_min) || (((uVar8 != 8 && (lVar10 < lVar7)) && (fVar14 < 0.0)))) {
      lVar7 = v_min;
    }
    if ((v_max < lVar7) || (((uVar8 != 8 && (lVar7 < lVar10)) && (0.0 < fVar14)))) {
      lVar7 = v_max;
    }
  }
  if (lVar10 != lVar7) {
    *v = lVar7;
    return true;
  }
  return lVar10 != lVar7;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}